

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::ConcatTransform(FormattingScene *this,Float *transform,FileLoc loc)

{
  long lVar1;
  string sStack_38;
  
  indent_abi_cxx11_(&sStack_38,this,0);
  Printf<std::__cxx11::string>("%sConcatTransform [ ",&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 4) {
    Printf<float&>("%f ",(float *)((long)transform + lVar1));
  }
  Printf<>(" ]\n");
  return;
}

Assistant:

void FormattingScene::ConcatTransform(Float transform[16], FileLoc loc) {
    Printf("%sConcatTransform [ ", indent());
    for (int i = 0; i < 16; ++i)
        Printf("%f ", transform[i]);
    Printf(" ]\n");
}